

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::supervised
          (FastText *this,Model *model,real lr,vector<int,_std::allocator<int>_> *line,
          vector<int,_std::allocator<int>_> *labels)

{
  result_type_conflict1 rVar1;
  size_type sVar2;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  Model *in_RSI;
  undefined4 in_XMM0_Da;
  int32_t i;
  uniform_int_distribution<int> uniform;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_stack_ffffffffffffffb8;
  uniform_int_distribution<int> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  if ((sVar2 != 0) && (sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDX), sVar2 != 0)) {
    std::vector<int,_std::allocator<int>_>::size(in_RCX);
    std::uniform_int_distribution<int>::uniform_int_distribution
              (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
               (int)in_stack_ffffffffffffffb8);
    rVar1 = std::uniform_int_distribution<int>::operator()
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)rVar1);
    Model::update(in_RSI,(vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                  (int32_t)((ulong)in_RDX >> 0x20),SUB84(in_RDX,0));
  }
  return;
}

Assistant:

void FastText::supervised(Model& model, real lr,
                          const std::vector<int32_t>& line,
                          const std::vector<int32_t>& labels) {
  if (labels.size() == 0 || line.size() == 0) return;
  std::uniform_int_distribution<> uniform(0, labels.size() - 1);
  int32_t i = uniform(model.rng);
  model.update(line, labels[i], lr);
}